

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_annotate.cpp
# Opt level: O0

void snestistics::guess_range
               (Trace *trace,RomAccessor *rom,AnnotationResolver *annotations,string *output_file)

{
  Pointer PVar1;
  uint uVar2;
  uint32_t uVar3;
  bool bVar4;
  bool bVar5;
  char *__filename;
  FILE *__stream;
  pointer ppVar6;
  size_type_conflict sVar7;
  reference pvVar8;
  reference this;
  reference puVar9;
  reference pvVar10;
  reference pvVar11;
  reference pAVar12;
  byte local_2a3;
  bool local_2a1;
  int local_294;
  undefined1 local_290 [8];
  Annotation k;
  const_iterator __end3;
  const_iterator __begin3;
  vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_> *__range3;
  bool collision;
  FoundRange *f_2;
  uint local_1e8;
  uint32_t fi;
  uint32_t longest_length;
  int longest_range;
  int longest;
  int num_found;
  FoundRange *merger_1;
  uint32_t t_2;
  int A_1;
  FoundRange *f_1;
  uint32_t t_1;
  FoundRange *merger;
  value_type local_1a8;
  int32_t t;
  int lowest_merge;
  int A;
  Pointer t1;
  int len;
  Annotation *target_function;
  iterator iStack_188;
  Pointer target;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  FoundRange *fj;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *branches_out;
  uint32_t merge_target;
  FoundRange *fb;
  uint32_t bi;
  uint b;
  iterator __end5;
  iterator __begin5;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range5;
  FoundRange *f;
  uint32_t ai;
  bool debug;
  uint32_t j;
  undefined1 local_110 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> merged_with;
  Pointer local_dc;
  bool jump_is_jsr;
  Pointer PStack_d8;
  bool op_is_jump_or_branch;
  Pointer jump_secondary_target;
  Pointer jump_target;
  bool relevant_jump;
  bool merge_long_jumps;
  Hint *hint;
  uint8_t opcode;
  Annotation *local_b8;
  Annotation *function;
  const_iterator cStack_a8;
  Pointer pc;
  undefined1 local_a0 [8];
  FoundRange found;
  _Self local_58;
  const_iterator it;
  vector<FoundRange,_std::allocator<FoundRange>_> found_ranges;
  int unknownCounter;
  FILE *output;
  string *output_file_local;
  AnnotationResolver *annotations_local;
  RomAccessor *rom_local;
  Trace *trace_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"wt");
  std::vector<FoundRange,_std::allocator<FoundRange>_>::vector
            ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_snestistics::Trace::OpVariantLookup,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
       ::begin(&trace->ops);
  do {
    found.branches_out._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<unsigned_int,_snestistics::Trace::OpVariantLookup,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
                 ::end(&trace->ops);
    bVar4 = std::operator!=(&local_58,
                            (_Self *)&found.branches_out._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
    if (!bVar4) {
      sVar7 = std::vector<FoundRange,_std::allocator<FoundRange>_>::size
                        ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it);
      j = 0xffffffff;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)&debug);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,sVar7,&j,
                 (allocator<unsigned_int> *)&debug);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)&debug);
      for (ai = 0; (sVar7 = std::vector<FoundRange,_std::allocator<FoundRange>_>::size
                                      ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it),
                   ai <= sVar7 &&
                   (sVar7 = std::vector<FoundRange,_std::allocator<FoundRange>_>::size
                                      ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it),
                   ai != sVar7)); ai = ai + 1) {
        branches_out._4_4_ = ai;
        while (pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,
                                   (ulong)branches_out._4_4_), *pvVar8 != 0xffffffff) {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,
                              (ulong)branches_out._4_4_);
          branches_out._4_4_ = *pvVar8;
        }
        pvVar11 = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                            ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,(ulong)ai);
        this = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                         ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,(ulong)ai);
        __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 begin(&pvVar11->branches_out);
        iStack_188 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::end(&pvVar11->branches_out);
        while (bVar4 = std::operator!=(&__end2,&stack0xfffffffffffffe78), bVar4) {
          puVar9 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
          target_function._4_4_ = *puVar9;
          bVar4 = guess_range::FoundRange::inside(this,target_function._4_4_);
          if (!bVar4) {
            _t1 = (Annotation *)0x0;
            AnnotationResolver::resolve_annotation
                      (annotations,target_function._4_4_,(Annotation **)&t1,(Annotation **)0x0);
            if (_t1 == (Annotation *)0x0) {
              if (target_function._4_4_ < this->start) {
                A = this->start - target_function._4_4_;
              }
              else {
                A = target_function._4_4_ - this->stop;
              }
              if (1000 < A) {
                this->num_long_jumps = this->num_long_jumps + 1;
              }
              if (target_function._4_4_ < this->start) {
                target_function._4_4_ =
                     AnnotationResolver::find_last_free_before_or_at
                               (annotations,this->start,target_function._4_4_);
                uVar3 = ai;
                if (target_function._4_4_ != 0xffffffff) {
                  do {
                    local_1a8 = uVar3;
                    merger._4_4_ = local_1a8 - 1;
                    if ((int)merger._4_4_ < 0) break;
                    pvVar11 = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                                        ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,
                                         (long)(int)merger._4_4_);
                    uVar3 = merger._4_4_;
                  } while (target_function._4_4_ <= pvVar11->stop);
                  if (local_1a8 != ai) {
                    while (pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                    operator[]((vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                *)local_110,(long)(int)local_1a8),
                          f_1._4_4_ = local_1a8, *pvVar8 != 0xffffffff) {
                      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          local_110,(long)(int)local_1a8);
                      local_1a8 = *pvVar8;
                    }
                    while (f_1._4_4_ = f_1._4_4_ + 1, f_1._4_4_ <= ai) {
                      pvVar11 = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                                          ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,
                                           (ulong)f_1._4_4_);
                      if ((pvVar11->valid & 1U) != 0) {
                        pvVar11->valid = false;
                        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                 operator[]((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                            local_110,(ulong)f_1._4_4_);
                        *pvVar8 = local_1a8;
                      }
                    }
                    PVar1 = this->stop;
                    pvVar11 = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                                        ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,
                                         (long)(int)local_1a8);
                    pvVar11->stop = PVar1;
                  }
                }
              }
              else if ((this->stop < target_function._4_4_) &&
                      (target_function._4_4_ =
                            AnnotationResolver::find_last_free_after_or_at
                                      (annotations,this->stop,target_function._4_4_),
                      merger_1._0_4_ = ai, target_function._4_4_ != 0xffffffff)) {
                while( true ) {
                  merger_1._0_4_ = (uint)merger_1 + 1;
                  sVar7 = std::vector<FoundRange,_std::allocator<FoundRange>_>::size
                                    ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it);
                  if ((sVar7 <= (uint)merger_1) ||
                     (pvVar11 = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                                          ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,
                                           (ulong)(uint)merger_1),
                     target_function._4_4_ < pvVar11->start)) break;
                  if ((pvVar11->valid & 1U) != 0) {
                    uVar2 = pvVar11->stop;
                    pvVar10 = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                                        ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,
                                         (ulong)branches_out._4_4_);
                    if (pvVar10->stop < uVar2) {
                      PVar1 = pvVar11->stop;
                      pvVar10 = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                                          ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,
                                           (ulong)branches_out._4_4_);
                      pvVar10->stop = PVar1;
                    }
                    pvVar11->valid = false;
                    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        local_110,(ulong)(uint)merger_1);
                    *pvVar8 = branches_out._4_4_;
                  }
                }
              }
            }
          }
          std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
        }
      }
      longest_range = 0;
      longest_length = 0xffffffff;
      fi = 0xffffffff;
      local_1e8 = 0;
      f_2._4_4_ = 0;
      do {
        sVar7 = std::vector<FoundRange,_std::allocator<FoundRange>_>::size
                          ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it);
        if (sVar7 <= f_2._4_4_) {
          printf("Found %d functions (longest Auto%04d, len=%d, range=%d)\n",
                 (ulong)(uint)longest_range,(ulong)longest_length,(ulong)local_1e8,(ulong)fi);
          fclose(__stream);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
          std::vector<FoundRange,_std::allocator<FoundRange>_>::~vector
                    ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it);
          return;
        }
        pvVar11 = std::vector<FoundRange,_std::allocator<FoundRange>_>::operator[]
                            ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,(ulong)f_2._4_4_
                            );
        if (4 < pvVar11->num_long_jumps) {
          printf("Long jumps to %06X-%06X (%d)\n",(ulong)pvVar11->start,(ulong)pvVar11->stop,
                 (ulong)(uint)pvVar11->num_long_jumps);
        }
        if ((pvVar11->valid & 1U) != 0) {
          bVar4 = false;
          __end3 = std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::
                   begin(&annotations->_annotations);
          k._112_8_ = std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                      ::end(&annotations->_annotations);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
                                             *)&k.startOfRange), bVar5) {
            pAVar12 = __gnu_cxx::
                      __normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
                      ::operator*(&__end3);
            Annotation::Annotation((Annotation *)local_290,pAVar12);
            if (local_290._0_4_ == ANNOTATION_FUNCTION) {
              if ((pvVar11->stop < (uint)k._104_4_) || ((uint)k._108_4_ < pvVar11->stop)) {
                local_294 = 0x25;
              }
              else {
                bVar4 = true;
                local_294 = 0x24;
              }
            }
            else {
              local_294 = 0;
            }
            Annotation::~Annotation((Annotation *)local_290);
            if ((local_294 != 0) && (local_294 == 0x24)) break;
            __gnu_cxx::
            __normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
            ::operator++(&__end3);
          }
          if (bVar4) {
            printf("Collision!\n");
          }
          else {
            if (local_1e8 < pvVar11->stop - pvVar11->start) {
              longest_length = longest_range;
              local_1e8 = (pvVar11->stop - pvVar11->start) + 1;
              fi = f_2._4_4_;
            }
            longest_range = longest_range + 1;
            fprintf(__stream,"function %06X %06X Auto%04d\n",(ulong)pvVar11->start,
                    (ulong)pvVar11->stop);
          }
        }
        f_2._4_4_ = f_2._4_4_ + 1;
      } while( true );
    }
    guess_range::FoundRange::FoundRange((FoundRange *)local_a0);
    while( true ) {
      cStack_a8 = std::
                  map<unsigned_int,_snestistics::Trace::OpVariantLookup,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
                  ::end(&trace->ops);
      bVar4 = std::operator!=(&local_58,&stack0xffffffffffffff58);
      if (!bVar4) break;
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>
               ::operator->(&local_58);
      function._4_4_ = ppVar6->first;
      local_b8 = (Annotation *)0x0;
      AnnotationResolver::resolve_annotation
                (annotations,function._4_4_,&local_b8,(Annotation **)0x0);
      if (local_b8 != (Annotation *)0x0) break;
      hint._3_1_ = RomAccessor::evalByte(rom,function._4_4_);
      if (local_a0._0_4_ == 0xffffffff) {
        local_a0._0_4_ = function._4_4_;
      }
      if ((jump_or_branch[hint._3_1_] & 1) == 0) {
        if (((hint._3_1_ == 0x40) || (hint._3_1_ == 0x6b)) || (hint._3_1_ == 0x60)) {
          local_a0._4_4_ = function._4_4_;
          std::vector<FoundRange,_std::allocator<FoundRange>_>::push_back
                    ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,(value_type *)local_a0);
          break;
        }
      }
      else {
        _jump_target = AnnotationResolver::hint(annotations,function._4_4_);
        local_2a1 = false;
        if (_jump_target != (Hint *)0x0) {
          local_2a1 = Hint::has_hint(_jump_target,ANNOTATE_MERGE);
        }
        jump_secondary_target._3_1_ = local_2a1;
        local_2a3 = 1;
        if (local_2a1 == false) {
          local_2a3 = branches8[hint._3_1_];
        }
        jump_secondary_target._2_1_ = local_2a3 & 1;
        bVar4 = decode_static_jump(hint._3_1_,rom,function._4_4_,&stack0xffffffffffffff28,&local_dc)
        ;
        if (_jump_target != (Hint *)0x0) {
          Hint::has_hint(_jump_target,JUMP_IS_JSR);
        }
        if ((((jump_secondary_target._2_1_ & 1) != 0) && (bVar4)) &&
           ((PStack_d8 != 0xffffffff && (bVar5 = same_bank(function._4_4_,PStack_d8), bVar5)))) {
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &found.valid,&stack0xffffffffffffff28);
        }
        if ((bVar4) && (local_dc == 0xffffffff)) {
          local_a0._4_4_ = function._4_4_;
          std::vector<FoundRange,_std::allocator<FoundRange>_>::push_back
                    ((vector<FoundRange,_std::allocator<FoundRange>_> *)&it,(value_type *)local_a0);
          break;
        }
      }
      merged_with.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>
                    ::operator++(&local_58,0);
    }
    guess_range::FoundRange::~FoundRange((FoundRange *)local_a0);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>::
    operator++(&local_58);
  } while( true );
}

Assistant:

void guess_range(const Trace &trace, const RomAccessor &rom, const AnnotationResolver &annotations, std::string &output_file) {

	FILE *output = fopen(output_file.c_str(), "wt");

	int unknownCounter = 0;

	struct FoundRange {
		Pointer start = INVALID_POINTER, stop = INVALID_POINTER;
		bool valid = true;

		bool inside(Pointer p) const { return p >= start && p <= stop; }

		int num_long_jumps = 0;

		std::set<Pointer> branches_out;
	};

	// TODO: Support trace annotation jump is jsr
	std::vector<FoundRange> found_ranges;

	for (auto it = trace.ops.begin(); it != trace.ops.end(); ++it) {
		FoundRange found;
		while (it != trace.ops.end()) {
			Pointer pc = it->first;

			const Annotation *function = nullptr;
			annotations.resolve_annotation(pc, &function);

			// We only want unknown but executed stuff!
			if (function)
				break;

			uint8_t opcode = rom.evalByte(pc);

			if (found.start == INVALID_POINTER)
				found.start = pc;

			if (jump_or_branch[opcode]) {
				const Hint *hint = annotations.hint(pc);
				bool merge_long_jumps = hint && hint->has_hint(Hint::ANNOTATE_MERGE);
				bool relevant_jump = merge_long_jumps || branches8[opcode];

				Pointer jump_target, jump_secondary_target;
				bool op_is_jump_or_branch = decode_static_jump(opcode, rom, pc, &jump_target, &jump_secondary_target);

				bool jump_is_jsr = false;
				if (hint && hint->has_hint(Hint::JUMP_IS_JSR))
					jump_is_jsr = true;

				if (relevant_jump && op_is_jump_or_branch && jump_target != INVALID_POINTER && same_bank(pc, jump_target)) {
					found.branches_out.insert(jump_target);
				}

				// Stop if we find a branch or a jump
				if (op_is_jump_or_branch && jump_secondary_target == INVALID_POINTER) {
					// If there is a secondary jump target (as in a branch) we don't need to stop
					found.stop = pc;
					found_ranges.push_back(found);
					break;
				}
			} else if (opcode == 0x40 || opcode == 0x6B || opcode == 0x60) {
				// Some sort of return (RTS, RTI, RTL)
				found.stop = pc;
				found_ranges.push_back(found);
				break;
			}
			it++;
		}
	}

	std::vector<uint32_t> merged_with(found_ranges.size(), -1);

	for (uint32_t j = 0; j <= found_ranges.size(); ++j) { // TODO: Make <= be just <

		bool debug = false;

		if (debug) {
			printf("Step %d\n", j);

			for (uint32_t ai = 0; ai < found_ranges.size(); ai++) {
				const FoundRange &f = found_ranges[ai];
				printf(" %d: %06X-%06X%s", ai, f.start, f.stop, f.valid ? "" : " (invalid)");
				if (merged_with[ai] != -1)
					printf(" (merged with %d)", merged_with[ai]);
				printf("\n");

				if (ai >= j)
					for (auto b : f.branches_out) {
						if (f.inside(b))
							continue;
						printf("   -> %06X", b);
						for (uint32_t bi = 0; bi < found_ranges.size(); ++bi) {
							const FoundRange &fb = found_ranges[bi];
							if (fb.start <= b && b <= fb.stop)
								printf(" %d", bi);
						}
						printf("\n");
					}
			}
		}

		// We went one extra round for debugging!
		if (j == found_ranges.size())
			break;

		uint32_t merge_target = j;
		while (merged_with[merge_target] != -1)
			merge_target = merged_with[merge_target];

		auto &branches_out = found_ranges[j].branches_out;

		FoundRange &fj = found_ranges[j];

		//printf("Doing %d, saving into %d\n", j, merge_target);
		for (Pointer target : branches_out) {
			// We have three cases; forward, backward or internal branches. We treat them separately for clarity
			if (fj.inside(target)) // Ignore internal branches/jumps
				continue;

			// TODO: This is not enough.. We must stop at any function in the range...
			//       Basically cut target at any function def...
			const Annotation *target_function = nullptr;
			annotations.resolve_annotation(target, &target_function);
			if (target_function)
				continue;

			int len = 0;
			if (target < fj.start) {
				len = fj.start - target;
			}
			else {
				len = target - fj.stop;
			}
			if (len > 1000) {
				fj.num_long_jumps++;
			}

			Pointer t1 = target;

			if (target < fj.start) {
				target = annotations.find_last_free_before_or_at(fj.start, target);
				if (target != t1) {
					int A = 9;
				}

				if (target == INVALID_POINTER)
					continue;
				// Branch going out to smaller addresses (before j)

				int lowest_merge = j;

				for (int32_t t = j - 1; t >= 0; --t) {
					FoundRange &merger = found_ranges[t];
					if (target > merger.stop) // Since ranges are sorted on start and non-overlapping we can stop here
						break;
					lowest_merge = t;
				}

				if (lowest_merge == j)
					continue;

				while (merged_with[lowest_merge] != -1)
					lowest_merge = merged_with[lowest_merge];

				// We want to merge the range (lowest_range, ..., j) into lowest_range
				for (uint32_t t = lowest_merge + 1; t <= j; t++) {
					FoundRange &f = found_ranges[t];
					if (f.valid) {
						f.valid = false;
						merged_with[t] = lowest_merge;
					}
				}

				found_ranges[lowest_merge].stop = fj.stop;

			} else if (target > fj.stop) {

				target = annotations.find_last_free_after_or_at(fj.stop, target);
				if (target != t1) {
					int A = 9;
				}

				if (target == INVALID_POINTER)
					continue;

				// Branch going out to larger addresses (after j)
				for (uint32_t t = j + 1; t<found_ranges.size(); ++t) {
					FoundRange &merger = found_ranges[t];
					if (target < merger.start) // Since ranges are sorted on start and non-overlapping we can stop here
						break;
					if (merger.valid) {
						// Merge t into j (the easy case)
						if (merger.stop > found_ranges[merge_target].stop)
							found_ranges[merge_target].stop = merger.stop;
						merger.valid = false; // Since we make it invalid it can only be merged once...
						merged_with[t] = merge_target;
					}
				}
			}
		}
	}

	int num_found = 0;

	int longest = -1, longest_range = -1;
	uint32_t longest_length = 0;

	for (uint32_t fi = 0; fi < found_ranges.size(); ++fi) {
		const FoundRange &f = found_ranges[fi];
		if (f.num_long_jumps > 4) {
			printf("Long jumps to %06X-%06X (%d)\n", f.start, f.stop, f.num_long_jumps);
		}

		if (f.valid) {
			bool collision = false;
			for (auto k : annotations._annotations) {
				if (k.type == AnnotationType::ANNOTATION_FUNCTION) {
					if (f.stop < k.startOfRange || f.stop > k.endOfRange) {
						continue;
					}
					else {
						collision = true;
						break;
					}
				}
			}
			if (collision) {
				printf("Collision!\n");
			}
			else {
				// TODO: Validate that there is no function annotation inside a range
				if (f.stop - f.start > longest_length) {
					longest = num_found;
					longest_length = f.stop - f.start + 1;
					longest_range = fi;
				}
				num_found++;
				fprintf(output, "function %06X %06X Auto%04d\n", f.start, f.stop, unknownCounter++);
			}
		}
	}

	printf("Found %d functions (longest Auto%04d, len=%d, range=%d)\n", num_found, longest, longest_length, longest_range);

	fclose(output);
}